

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_d52e3c::HandleJSONCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,cmExecutionStatus *status)

{
  cmMakefile *this;
  uint *puVar1;
  optional<(anonymous_namespace)::Args> errorPath;
  optional<(anonymous_namespace)::Args> errorPath_00;
  optional<(anonymous_namespace)::Args> errorPath_01;
  optional<(anonymous_namespace)::Args> errorPath_02;
  optional<(anonymous_namespace)::Args> errorPath_03;
  string_view value;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  bool bVar4;
  ushort uVar5;
  ArrayIndex AVar6;
  ArrayIndex AVar7;
  int iVar8;
  ValueType VVar9;
  string *name;
  string *psVar10;
  string *psVar11;
  json_error *pjVar12;
  Value *pVVar13;
  Value *this_00;
  uint uVar14;
  ulong uVar15;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *extraout_RDX_01;
  Value *extraout_RDX_02;
  Value *value_00;
  Value *extraout_RDX_03;
  string_view error;
  string_view error_00;
  string_view error_01;
  string_view error_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  string_view error_03;
  string_view error_04;
  string_view error_05;
  string_view error_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_03;
  Args path;
  Args path_00;
  Args path_01;
  string_view value_01;
  Args path_02;
  Args path_03;
  string_view value_02;
  Args path_04;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view sVar17;
  const_iterator cVar18;
  Args args;
  Value newValue;
  Value json;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  ptrdiff_t local_120;
  char *local_118;
  Value local_110;
  undefined1 local_e8 [8];
  char *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ValueIteratorBase local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_90;
  undefined1 local_88;
  undefined7 uStack_87;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50;
  uint7 uStack_4f;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  uint7 uStack_37;
  
  this = status->Makefile;
  _Stack_148._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_150._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  sVar17._M_str = "missing out-var argument";
  sVar17._M_len = 0x18;
  name = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_150,sVar17);
  if (((local_150._M_current != _Stack_148._M_current) &&
      (*(long *)((long)local_150._M_current + 8) == 0xe)) &&
     (*(long *)((long)*(long **)local_150._M_current + 6) == 0x454c424149524156 &&
      **(long **)local_150._M_current == 0x41565f524f525245)) {
    (anonymous_namespace)::Args::PopFront_abi_cxx11_
              ((Args *)&local_150,(string_view)(ZEXT816(0x70ce89) << 0x40));
    error_05._M_str = "missing error-var argument";
    error_05._M_len = 0x1a;
    psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_150,error_05);
    value_01._M_str = "NOTFOUND";
    value_01._M_len = 8;
    cmMakefile::AddDefinition(this,psVar10,value_01);
  }
  error._M_str = "missing mode argument";
  error._M_len = 0x15;
  psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_150,error);
  if (3 < psVar10->_M_string_length - 3) goto LAB_002d73c8;
  puVar1 = (uint *)(psVar10->_M_dataplus)._M_p;
  switch(psVar10->_M_string_length) {
  case 3:
    if ((*(char *)((long)puVar1 + 2) != 'T' || (short)*puVar1 != 0x4547) &&
       (*(char *)((long)puVar1 + 2) != 'T' || (short)*puVar1 != 0x4553)) goto LAB_002d73c8;
    break;
  case 4:
    if (*puVar1 != 0x45505954) goto LAB_002d73c8;
    break;
  case 5:
    uVar14 = *puVar1 ^ 0x41555145;
    uVar5 = (byte)puVar1[1] ^ 0x4c;
LAB_002d72ab:
    if (uVar5 != 0 || uVar14 != 0) {
LAB_002d73c8:
      pjVar12 = (json_error *)__cxa_allocate_exception(0x28);
      local_140._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15;
      local_140._8_8_ = "got an invalid mode \'";
      local_130._8_8_ = (psVar10->_M_dataplus)._M_p;
      local_130._0_8_ = psVar10->_M_string_length;
      local_120 = 0x41;
      local_118 = "\', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET,  EQUAL";
      local_38 = 0;
      errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
      super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current =
           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )uStack_40;
      errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
      super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_48;
      errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
      super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = (ulong)uStack_37 << 8;
      message._M_len = 3;
      message._M_array = (iterator)local_140;
      json_error::json_error(pjVar12,message,errorPath);
      __cxa_throw(pjVar12,&(anonymous_namespace)::json_error::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    break;
  case 6:
    if (((short)puVar1[1] != 0x5245 || *puVar1 != 0x424d454d) &&
       ((short)puVar1[1] != 0x4854 || *puVar1 != 0x474e454c)) {
      uVar14 = *puVar1 ^ 0x4f4d4552;
      uVar5 = (ushort)puVar1[1] ^ 0x4556;
      goto LAB_002d72ab;
    }
  }
  error_00._M_str = "missing json string argument";
  error_00._M_len = 0x1c;
  psVar11 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_150,error_00);
  ReadJson(&local_110,psVar11);
  uVar15 = psVar10->_M_string_length - 3;
  if (3 < uVar15) goto LAB_002d799a;
  puVar1 = (uint *)(psVar10->_M_dataplus)._M_p;
  path_01.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&switchD_002d72fa::switchdataD_006c0298 +
       (long)(int)(&switchD_002d72fa::switchdataD_006c0298)[uVar15]);
  switch(psVar10->_M_string_length) {
  case 3:
    path_03.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current._0_4_ = (ushort)*puVar1 ^ 0x4547;
    if (*(char *)((long)puVar1 + 2) == 'T' &&
        (short)(uint)path_03.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .End._M_current == 0) {
      path_03.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_148._M_current;
      path_03.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current._4_4_ = 0;
      this_00 = ResolvePath((anon_unknown_dwarf_d52e3c *)&local_110,(Value *)local_150._M_current,
                            path_03);
      bVar4 = Json::Value::isObject(this_00);
      pVVar13 = extraout_RDX_00;
      if ((bVar4) || (bVar4 = Json::Value::isArray(this_00), pVVar13 = extraout_RDX_01, bVar4)) {
        (anonymous_namespace)::WriteJson_abi_cxx11_
                  ((string *)local_140,(_anonymous_namespace_ *)this_00,pVVar13);
        value_02._M_str = (char *)local_140._0_8_;
        value_02._M_len = local_140._8_8_;
        cmMakefile::AddDefinition(this,name,value_02);
      }
      else {
        bVar4 = Json::Value::isBool(this_00);
        if (bVar4) {
          bVar4 = Json::Value::asBool(this_00);
          cmMakefile::AddDefinitionBool(this,name,bVar4);
          goto LAB_002d799a;
        }
        Json::Value::asString_abi_cxx11_((String *)local_140,this_00);
        value_06._M_str = (char *)local_140._0_8_;
        value_06._M_len = local_140._8_8_;
        cmMakefile::AddDefinition(this,name,value_06);
      }
      goto LAB_002d797f;
    }
    uVar14 = (ushort)*puVar1 ^ 0x4553;
    _Var16._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar14;
    if (*(char *)((long)puVar1 + 2) != 'T' || (short)uVar14 != 0) goto LAB_002d799a;
    error_01._M_str = "missing new value remove";
    error_01._M_len = 0x18;
    psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_150,error_01);
    error_02._M_str = "missing member name to add";
    error_02._M_len = 0x1a;
    psVar11 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_150,error_02);
    _Var3._M_current = _Stack_148._M_current;
    _Var2._M_current = local_150._M_current;
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current = _Var16._M_current;
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current = _Stack_148._M_current;
    pVVar13 = ResolvePath((anon_unknown_dwarf_d52e3c *)&local_110,(Value *)local_150._M_current,path
                         );
    ReadJson((Value *)local_140,psVar10);
    bVar4 = Json::Value::isObject(pVVar13);
    if (bVar4) {
      pVVar13 = Json::Value::operator[](pVVar13,psVar11);
      Json::Value::operator=(pVVar13,(Value *)local_140);
      pVVar13 = extraout_RDX;
    }
    else {
      bVar4 = Json::Value::isArray(pVVar13);
      if (!bVar4) {
        pjVar12 = (json_error *)__cxa_allocate_exception(0x28);
        local_e8 = (undefined1  [8])&DAT_00000044;
        local_e0 = "SET needs to be called with an element of type OBJECT or ARRAY, got ";
        VVar9 = Json::Value::type(pVVar13);
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )JsonTypeToString(VVar9);
        local_50 = 0;
        errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )uStack_58;
        errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_60;
        errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = (ulong)uStack_4f << 8;
        message_02._M_len = 2;
        message_02._M_array = (iterator)local_e8;
        json_error::json_error(pjVar12,message_02,errorPath_02);
        __cxa_throw(pjVar12,&(anonymous_namespace)::json_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      local_e0 = (char *)(_Var3._M_current + 1);
      local_e8 = (undefined1  [8])_Var2._M_current;
      local_d8._M_local_buf[0] = 1;
      AVar7 = ParseIndex(psVar11,(optional<(anonymous_namespace)::Args> *)local_e8,0xffffffff);
      bVar4 = Json::Value::isValidIndex(pVVar13,AVar7);
      if (bVar4) {
        pVVar13 = Json::Value::operator[](pVVar13,AVar7);
        Json::Value::operator=(pVVar13,(Value *)local_140);
        pVVar13 = extraout_RDX_02;
      }
      else {
        Json::Value::append(pVVar13,(Value *)local_140);
        pVVar13 = extraout_RDX_03;
      }
    }
    (anonymous_namespace)::WriteJson_abi_cxx11_
              ((string *)local_e8,(_anonymous_namespace_ *)&local_110,pVVar13);
    value_05._M_str = (char *)local_e8;
    value_05._M_len = (size_t)local_e0;
    cmMakefile::AddDefinition(this,name,value_05);
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
    }
    break;
  case 4:
    if (*puVar1 == 0x45505954) {
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_148._M_current;
      pVVar13 = ResolvePath((anon_unknown_dwarf_d52e3c *)&local_110,(Value *)local_150._M_current,
                            path_01);
      VVar9 = Json::Value::type(pVVar13);
      sVar17 = JsonTypeToString(VVar9);
      cmMakefile::AddDefinition(this,name,sVar17);
    }
    goto LAB_002d799a;
  case 5:
    if ((char)puVar1[1] != 'L' || *puVar1 != 0x41555145) goto LAB_002d799a;
    error_03._M_str = "missing second json string argument";
    error_03._M_len = 0x23;
    psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_150,error_03);
    ReadJson((Value *)local_140,psVar10);
    bVar4 = Json::Value::operator==(&local_110,(Value *)local_140);
    cmMakefile::AddDefinitionBool(this,name,bVar4);
    break;
  case 6:
    _Var16._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (ulong)(*puVar1 ^ 0x424d454d);
    if ((ushort)puVar1[1] == 0x5245 && (*puVar1 ^ 0x424d454d) == 0) {
      error_06._M_str = "missing member index";
      error_06._M_len = 0x14;
      psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_150,error_06);
      _Var3._M_current = _Stack_148._M_current;
      _Var2._M_current = local_150._M_current;
      path_02.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var16._M_current;
      path_02.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_148._M_current;
      pVVar13 = ResolvePath((anon_unknown_dwarf_d52e3c *)&local_110,(Value *)local_150._M_current,
                            path_02);
      bVar4 = Json::Value::isObject(pVVar13);
      if (!bVar4) {
        pjVar12 = (json_error *)__cxa_allocate_exception(0x28);
        local_140._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3e;
        local_140._8_8_ = "MEMBER needs to be called with an element of type OBJECT, got ";
        VVar9 = Json::Value::type(pVVar13);
        local_130 = (undefined1  [16])JsonTypeToString(VVar9);
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_150._M_current;
        paStack_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Stack_148._M_current;
        local_68 = 1;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_67;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Stack_148._M_current;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_150._M_current;
        message_00._M_len = 2;
        message_00._M_array = (iterator)local_140;
        json_error::json_error(pjVar12,message_00,errorPath_00);
        __cxa_throw(pjVar12,&(anonymous_namespace)::json_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      local_140._8_8_ = _Var3._M_current + 1;
      local_140._0_8_ = _Var2._M_current;
      local_130[0] = 1;
      AVar6 = Json::Value::size(pVVar13);
      iVar8 = ParseIndex(psVar10,(optional<(anonymous_namespace)::Args> *)local_140,AVar6);
      cVar18 = Json::Value::begin(pVVar13);
      local_c8.current_ = cVar18.super_ValueIteratorBase.current_._M_node;
      local_c8.isNull_ = cVar18.super_ValueIteratorBase.isNull_;
      if (iVar8 < 1) {
        if (iVar8 != 0) {
          do {
            Json::ValueIteratorBase::decrement(&local_c8);
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
        }
      }
      else {
        do {
          Json::ValueIteratorBase::increment(&local_c8);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      local_e8 = (undefined1  [8])local_c8.current_._M_node;
      local_e0 = (char *)CONCAT71(local_e0._1_7_,local_c8.isNull_);
      Json::ValueIteratorBase::name_abi_cxx11_((String *)local_140,(ValueIteratorBase *)local_e8);
      value_03._M_str = (char *)local_140._0_8_;
      value_03._M_len = local_140._8_8_;
      cmMakefile::AddDefinition(this,name,value_03);
    }
    else {
      path_04.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current._0_4_ = *puVar1 ^ 0x474e454c;
      if ((ushort)puVar1[1] == 0x4854 &&
          (uint)path_04.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .End._M_current == 0) {
        path_04.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current = _Stack_148._M_current;
        path_04.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current._4_4_ = 0;
        pVVar13 = ResolvePath((anon_unknown_dwarf_d52e3c *)&local_110,(Value *)local_150._M_current,
                              path_04);
        bVar4 = Json::Value::isArray(pVVar13);
        if ((!bVar4) && (bVar4 = Json::Value::isObject(pVVar13), !bVar4)) {
          pjVar12 = (json_error *)__cxa_allocate_exception(0x28);
          local_140._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x47;
          local_140._8_8_ =
               "LENGTH needs to be called with an element of type ARRAY or OBJECT, got ";
          VVar9 = Json::Value::type(pVVar13);
          local_130 = (undefined1  [16])JsonTypeToString(VVar9);
          local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_150._M_current;
          paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Stack_148._M_current;
          local_88 = 1;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_87;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )_Stack_148._M_current;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_150._M_current;
          message_01._M_len = 2;
          message_01._M_array = (iterator)local_140;
          json_error::json_error(pjVar12,message_01,errorPath_01);
          __cxa_throw(pjVar12,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        AVar6 = Json::Value::size(pVVar13);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_140,AVar6);
        value._M_str = (char *)local_140._8_8_;
        value._M_len = local_140._0_8_;
        cmMakefile::AddDefinition(this,name,value);
        goto LAB_002d799a;
      }
      _Var16._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)(*puVar1 ^ 0x4f4d4552);
      if ((ushort)puVar1[1] != 0x4556 || (*puVar1 ^ 0x4f4d4552) != 0) goto LAB_002d799a;
      error_04._M_str = "missing member or index to remove";
      error_04._M_len = 0x21;
      psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_150,error_04);
      _Var3._M_current = _Stack_148._M_current;
      _Var2._M_current = local_150._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var16._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_148._M_current;
      pVVar13 = ResolvePath((anon_unknown_dwarf_d52e3c *)&local_110,(Value *)local_150._M_current,
                            path_00);
      bVar4 = Json::Value::isArray(pVVar13);
      if (bVar4) {
        local_140._8_8_ = _Var3._M_current + 1;
        local_140._0_8_ = _Var2._M_current;
        local_130[0] = 1;
        AVar6 = Json::Value::size(pVVar13);
        AVar7 = ParseIndex(psVar10,(optional<(anonymous_namespace)::Args> *)local_140,AVar6);
        Json::Value::Value((Value *)local_140,nullValue);
        Json::Value::removeIndex(pVVar13,AVar7,(Value *)local_140);
      }
      else {
        bVar4 = Json::Value::isObject(pVVar13);
        if (!bVar4) {
          pjVar12 = (json_error *)__cxa_allocate_exception(0x28);
          local_140._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x47;
          local_140._8_8_ =
               "REMOVE needs to be called with an element of type ARRAY or OBJECT, got ";
          VVar9 = Json::Value::type(pVVar13);
          local_130 = (undefined1  [16])JsonTypeToString(VVar9);
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_150._M_current;
          paStack_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Stack_148._M_current;
          local_a8 = 1;
          errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_a7;
          errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
          errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )_Stack_148._M_current;
          errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_150._M_current;
          message_03._M_len = 2;
          message_03._M_array = (iterator)local_140;
          json_error::json_error(pjVar12,message_03,errorPath_03);
          __cxa_throw(pjVar12,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        Json::Value::Value((Value *)local_140,nullValue);
        Json::Value::removeMember(pVVar13,psVar10,(Value *)local_140);
      }
      Json::Value::~Value((Value *)local_140);
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)local_140,(_anonymous_namespace_ *)&local_110,value_00);
      value_04._M_str = (char *)local_140._0_8_;
      value_04._M_len = local_140._8_8_;
      cmMakefile::AddDefinition(this,name,value_04);
    }
LAB_002d797f:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130) {
      operator_delete((void *)local_140._0_8_,local_130._0_8_ + 1);
    }
    goto LAB_002d799a;
  }
  Json::Value::~Value((Value *)local_140);
LAB_002d799a:
  Json::Value::~Value(&local_110);
  return true;
}

Assistant:

bool HandleJSONCommand(std::vector<std::string> const& arguments,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)

  auto& makefile = status.GetMakefile();
  Args args{ arguments.begin() + 1, arguments.end() };

  const std::string* errorVariable = nullptr;
  const std::string* outputVariable = nullptr;
  bool success = true;

  try {
    outputVariable = &args.PopFront("missing out-var argument"_s);

    if (!args.empty() && *args.begin() == "ERROR_VARIABLE"_s) {
      args.PopFront("");
      errorVariable = &args.PopFront("missing error-var argument"_s);
      makefile.AddDefinition(*errorVariable, "NOTFOUND"_s);
    }

    const auto& mode = args.PopFront("missing mode argument"_s);
    if (mode != "GET"_s && mode != "TYPE"_s && mode != "MEMBER"_s &&
        mode != "LENGTH"_s && mode != "REMOVE"_s && mode != "SET"_s &&
        mode != "EQUAL"_s) {
      throw json_error(
        { "got an invalid mode '"_s, mode,
          "', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET, "
          " EQUAL"_s });
    }

    const auto& jsonstr = args.PopFront("missing json string argument"_s);
    Json::Value json = ReadJson(jsonstr);

    if (mode == "GET"_s) {
      const auto& value = ResolvePath(json, args);
      if (value.isObject() || value.isArray()) {
        makefile.AddDefinition(*outputVariable, WriteJson(value));
      } else if (value.isBool()) {
        makefile.AddDefinitionBool(*outputVariable, value.asBool());
      } else {
        makefile.AddDefinition(*outputVariable, value.asString());
      }

    } else if (mode == "TYPE"_s) {
      const auto& value = ResolvePath(json, args);
      makefile.AddDefinition(*outputVariable, JsonTypeToString(value.type()));

    } else if (mode == "MEMBER"_s) {
      const auto& indexStr = args.PopBack("missing member index"_s);
      const auto& value = ResolvePath(json, args);
      if (!value.isObject()) {
        throw json_error({ "MEMBER needs to be called with an element of "
                           "type OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }
      const auto index = ParseIndex(
        indexStr, Args{ args.begin(), args.end() + 1 }, value.size());
      const auto memIt = std::next(value.begin(), index);
      makefile.AddDefinition(*outputVariable, memIt.name());

    } else if (mode == "LENGTH"_s) {
      const auto& value = ResolvePath(json, args);
      if (!value.isArray() && !value.isObject()) {
        throw json_error({ "LENGTH needs to be called with an "
                           "element of type ARRAY or OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }

      cmAlphaNum sizeStr{ value.size() };
      makefile.AddDefinition(*outputVariable, sizeStr.View());

    } else if (mode == "REMOVE"_s) {
      const auto& toRemove =
        args.PopBack("missing member or index to remove"_s);
      auto& value = ResolvePath(json, args);

      if (value.isArray()) {
        const auto index = ParseIndex(
          toRemove, Args{ args.begin(), args.end() + 1 }, value.size());
        Json::Value removed;
        value.removeIndex(index, &removed);

      } else if (value.isObject()) {
        Json::Value removed;
        value.removeMember(toRemove, &removed);

      } else {
        throw json_error({ "REMOVE needs to be called with an "
                           "element of type ARRAY or OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }
      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "SET"_s) {
      const auto& newValueStr = args.PopBack("missing new value remove"_s);
      const auto& toAdd = args.PopBack("missing member name to add"_s);
      auto& value = ResolvePath(json, args);

      Json::Value newValue = ReadJson(newValueStr);
      if (value.isObject()) {
        value[toAdd] = newValue;
      } else if (value.isArray()) {
        const auto index =
          ParseIndex(toAdd, Args{ args.begin(), args.end() + 1 });
        if (value.isValidIndex(index)) {
          value[static_cast<int>(index)] = newValue;
        } else {
          value.append(newValue);
        }
      } else {
        throw json_error({ "SET needs to be called with an "
                           "element of type OBJECT or ARRAY, got "_s,
                           JsonTypeToString(value.type()) });
      }

      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "EQUAL"_s) {
      const auto& jsonstr2 =
        args.PopFront("missing second json string argument"_s);
      Json::Value json2 = ReadJson(jsonstr2);
      makefile.AddDefinitionBool(*outputVariable, json == json2);
    }

  } catch (const json_error& e) {
    if (outputVariable && e.ErrorPath) {
      const auto errorPath = cmJoin(*e.ErrorPath, "-");
      makefile.AddDefinition(*outputVariable,
                             cmCatViews({ errorPath, "-NOTFOUND"_s }));
    } else if (outputVariable) {
      makefile.AddDefinition(*outputVariable, "NOTFOUND"_s);
    }

    if (errorVariable) {
      makefile.AddDefinition(*errorVariable, e.what());
    } else {
      status.SetError(cmCatViews({ "sub-command JSON "_s, e.what(), "."_s }));
      success = false;
    }
  }
  return success;
#else
  status.SetError(cmStrCat(arguments[0], " not available during bootstrap"_s));
  return false;
#endif
}